

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

uint64_t anon_unknown.dwarf_548b::MurmurHash64A(void *key,size_t len)

{
  ulong uVar1;
  uint64_t k;
  uchar *data;
  uint64_t h;
  int r;
  uint64_t m;
  size_t len_local;
  void *key_local;
  
  data = (uchar *)(len * -0x395b586ca42e166b ^ 0xdecafbaddecafbad);
  k = (uint64_t)key;
  for (m = len; 7 < m; m = m - 8) {
    data = (uchar *)((((ulong)(*(long *)k * -0x395b586ca42e166b) >> 0x2f ^
                      *(long *)k * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ (ulong)data) *
                    -0x395b586ca42e166b);
    k = k + 8;
  }
  switch((uint)m & 7) {
  case 7:
    data = (uchar *)((ulong)*(byte *)(k + 6) << 0x30 ^ (ulong)data);
  case 6:
    data = (uchar *)((ulong)*(byte *)(k + 5) << 0x28 ^ (ulong)data);
  case 5:
    data = (uchar *)((ulong)*(byte *)(k + 4) << 0x20 ^ (ulong)data);
  case 4:
    data = (uchar *)((ulong)*(byte *)(k + 3) << 0x18 ^ (ulong)data);
  case 3:
    data = (uchar *)((ulong)*(byte *)(k + 2) << 0x10 ^ (ulong)data);
  case 2:
    data = (uchar *)((ulong)*(byte *)(k + 1) << 8 ^ (ulong)data);
  case 1:
    data = (uchar *)(((ulong)*(byte *)k ^ (ulong)data) * -0x395b586ca42e166b);
  default:
    uVar1 = ((ulong)data >> 0x2f ^ (ulong)data) * -0x395b586ca42e166b;
    return uVar1 >> 0x2f ^ uVar1;
  }
}

Assistant:

inline
uint64_t MurmurHash64A(const void* key, size_t len) {
  static const uint64_t seed = 0xDECAFBADDECAFBADull;
  const uint64_t m = BIG_CONSTANT(0xc6a4a7935bd1e995);
  const int r = 47;
  uint64_t h = seed ^ (len * m);
  const unsigned char* data = (const unsigned char*)key;
  while (len >= 8) {
    uint64_t k;
    memcpy(&k, data, sizeof k);
    k *= m;
    k ^= k >> r;
    k *= m;
    h ^= k;
    h *= m;
    data += 8;
    len -= 8;
  }
  switch (len & 7)
  {
  case 7: h ^= uint64_t(data[6]) << 48;
          NINJA_FALLTHROUGH;
  case 6: h ^= uint64_t(data[5]) << 40;
          NINJA_FALLTHROUGH;
  case 5: h ^= uint64_t(data[4]) << 32;
          NINJA_FALLTHROUGH;
  case 4: h ^= uint64_t(data[3]) << 24;
          NINJA_FALLTHROUGH;
  case 3: h ^= uint64_t(data[2]) << 16;
          NINJA_FALLTHROUGH;
  case 2: h ^= uint64_t(data[1]) << 8;
          NINJA_FALLTHROUGH;
  case 1: h ^= uint64_t(data[0]);
          h *= m;
  };
  h ^= h >> r;
  h *= m;
  h ^= h >> r;
  return h;
}